

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O2

err_t bakeBSTSRunB(octet *key,bign_params *params,bake_settings *settings,octet *privkeyb,
                  bake_cert *certb,bake_certval_i vala,read_i read,write_i write,void *file)

{
  long lVar1;
  bign_params *pbVar2;
  bool_t bVar3;
  err_t eVar4;
  ulong uVar5;
  size_t sVar6;
  octet *in;
  ulong uVar7;
  blob_t blob;
  ulong uVar8;
  octet *poVar9;
  octet *out;
  size_t len;
  octet *local_58;
  bign_params *local_50;
  bake_certval_i local_48;
  octet *local_40;
  octet *local_38;
  
  local_48 = vala;
  bVar3 = memIsValid(key,0x20);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = memIsValid(certb,0x18);
  if (bVar3 == 0) {
    return 0x6d;
  }
  uVar8 = params->l;
  if (((uVar8 != 0x80) && (uVar8 != 0x100)) && (uVar8 != 0xc0)) {
    return 0x1f6;
  }
  uVar5 = (uVar8 >> 2) + certb->len + 8;
  uVar7 = uVar8 >> 1;
  if (uVar8 >> 1 <= uVar5) {
    uVar7 = uVar5;
  }
  local_50 = params;
  sVar6 = bakeBSTS_keep(uVar8);
  in = (octet *)blobCreate(sVar6 + uVar7 + 0x200);
  if (in == (octet *)0x0) {
    return 0x6e;
  }
  uVar8 = local_50->l >> 1;
  uVar7 = (local_50->l >> 2) + certb->len + 8;
  if (uVar8 <= uVar7) {
    uVar8 = uVar7;
  }
  poVar9 = in + uVar8 + 0x200;
  local_38 = key;
  eVar4 = bakeBSTSStart(poVar9,local_50,settings,privkeyb,certb);
  if (eVar4 == 0) {
    out = in + 0x200;
    eVar4 = bakeBSTSStep2(out,poVar9);
    pbVar2 = local_50;
    if ((eVar4 == 0) && (eVar4 = (*write)(&len,out,local_50->l >> 1,file), eVar4 == 0)) {
      eVar4 = (*read)(&len,in,0x200,file);
      if (eVar4 == 0xffffffff) {
        eVar4 = bakeBSTSStep4(out,in,len,local_48,poVar9);
        if (eVar4 != 0) goto LAB_0011ede6;
        lVar1 = certb->len + (pbVar2->l >> 2);
        local_58 = poVar9;
      }
      else {
        if (eVar4 != 0) goto LAB_0011ede6;
        blob = (blob_t)0x0;
        local_58 = poVar9;
        local_40 = out;
        while (eVar4 == 0) {
          sVar6 = blobSize(blob);
          blob = blobResize(blob,sVar6 + len);
          if (blob == (blob_t)0x0) goto LAB_0011efa8;
          sVar6 = blobSize(blob);
          memCopy((void *)((long)blob + (sVar6 - len)),in,len);
          eVar4 = (*read)(&len,in,0x200,file);
        }
        if (eVar4 != 0xffffffff) {
          blobClose(blob);
          goto LAB_0011ede6;
        }
        sVar6 = blobSize(blob);
        poVar9 = (octet *)blobResize(blob,sVar6 + len);
        if (poVar9 == (octet *)0x0) {
LAB_0011efa8:
          blobClose(in);
          return 0x6e;
        }
        sVar6 = blobSize(poVar9);
        memCopy(poVar9 + (sVar6 - len),in,len);
        sVar6 = blobSize(poVar9);
        out = local_40;
        eVar4 = bakeBSTSStep4(local_40,poVar9,sVar6,local_48,local_58);
        blobClose(poVar9);
        if (eVar4 != 0) goto LAB_0011ede6;
        lVar1 = certb->len + (local_50->l >> 2);
      }
      eVar4 = (*write)(&len,out,lVar1 + 8,file);
      if (eVar4 == 0) {
        eVar4 = bakeBSTSStepG(local_38,local_58);
      }
    }
  }
LAB_0011ede6:
  blobClose(in);
  return eVar4;
}

Assistant:

err_t bakeBSTSRunB(octet key[32], const bign_params* params,
	const bake_settings* settings, const octet privkeyb[],
	const bake_cert* certb, bake_certval_i vala,
	read_i read, write_i write, void* file)
{
	err_t code;
	size_t len;
	// блоб
	blob_t blob;
	octet* in;			/* [512] */
	octet* out;			/* [MAX2(l / 2, l / 4 + certb->len + 8)] */
	void* state;		/* [bakeBSTS_keep()] */
	// проверить входные данные
	if (!memIsValid(key, 32) ||
		!memIsValid(certb, sizeof(bake_cert)))
		return ERR_BAD_INPUT;
	// создать блоб
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	blob = blobCreate(512 +
		MAX2(params->l / 2, params->l / 4 + certb->len + 8) +
		bakeBSTS_keep(params->l));
	if (blob == 0)
		return ERR_OUTOFMEMORY;
	// раскладка блоба
	in = (octet*)blob;
	out = in + 512;
	state = out + MAX2(params->l / 2, params->l / 4 + certb->len + 8);
	// старт
	code = bakeBSTSStart(state, params, settings, privkeyb, certb);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 2
	code = bakeBSTSStep2(out, state);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = write(&len, out, params->l / 2, file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 4: прочитать блок M2
	code = read(&len, in, 512, file);
	// шаг 4: M2 из одного блока?
	if (code == ERR_MAX)
	{
		code = bakeBSTSStep4(out, in, len, vala, state);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = write(&len, out, params->l / 4 + certb->len + 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// шаг 4: ошибка при чтении
	else if (code != ERR_OK)
	{
		blobClose(blob);
		return code;
	}
	// шаг 4: обработать M2 из нескольких блоков
	else
	{
		blob_t M2 = 0;
		while (code == ERR_OK)
		{
			if ((M2 = blobResize(M2, blobSize(M2) + len)) == 0)
			{
				blobClose(blob);
				return ERR_OUTOFMEMORY;
			}
			memCopy((octet*)M2 + blobSize(M2) - len, in, len);
			code = read(&len, in, 512, file);
		}
		if (code != ERR_MAX)
		{
			blobClose(M2);
			blobClose(blob);
			return code;
		}
		if ((M2 = blobResize(M2, blobSize(M2) + len)) == 0)
		{
			blobClose(blob);
			return ERR_OUTOFMEMORY;
		}
		memCopy((octet*)M2 + blobSize(M2) - len, in, len);
		code = bakeBSTSStep4(out, M2, blobSize(M2), vala, state);
		blobClose(M2);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = write(&len, out, params->l / 4 + certb->len + 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// завершение
	code = bakeBSTSStepG(key, state);
	blobClose(blob);
	return code;
}